

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O3

int __thiscall Indexing::ClauseCodeTree::ClauseMatcher::init(ClauseMatcher *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar2
  ;
  bool in_CL;
  ulong uVar3;
  Literal *pLVar4;
  Clause *in_RDX;
  uint uVar5;
  LitInfo *pLVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  *this_00;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  bool seekOnlySuccess;
  LitInfo local_68;
  uint local_4c;
  ulong local_48;
  uint local_3c;
  ulong local_38;
  
  this->query = in_RDX;
  this->tree = (ClauseCodeTree *)ctx;
  this->sres = in_CL;
  pRVar2 = (this->lms)._stack;
  this_00 = (this->lms)._cursor;
  if (this_00 != pRVar2) {
    do {
      this_00 = this_00 + -1;
      Lib::
      Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(this_00);
      pRVar2 = (this->lms)._stack;
    } while (this_00 != pRVar2);
    in_RDX = this->query;
  }
  (this->lms)._cursor = pRVar2;
  uVar11 = *(ulong *)&in_RDX->field_0x38;
  local_4c = (uint)uVar11 & 0xfffff;
  if ((uVar11 & 0xfffff) == 0) {
    Lib::DArray<Indexing::CodeTree::LitInfo>::ensure(&this->lInfos,0);
    if (this->sres == false) goto LAB_002b72fc;
  }
  else {
    uVar3 = 0;
    uVar5 = local_4c;
    do {
      uVar7 = uVar5;
      local_3c = (in_RDX->_literals[uVar3]->super_Term)._functor;
      uVar5 = uVar7 + (local_3c == 0);
      uVar3 = uVar3 + 1;
    } while (((uint)uVar11 & 0xfffff) != uVar3);
    local_48 = uVar11;
    Lib::DArray<Indexing::CodeTree::LitInfo>::ensure
              (&this->lInfos,(ulong)(uVar5 << (this->sres & 0x1fU)));
    if ((uVar11 & 0xfffff) != 0) {
      uVar11 = (ulong)((uint)local_48 & 0xfffff);
      uVar10 = 0;
      uVar3 = 0;
      local_38 = uVar11;
      do {
        pLVar4 = this->query->_literals[uVar10];
        if (*(int *)&(pLVar4->super_Term).field_0xc < 0) {
          iVar1 = 0;
          do {
            pLVar4 = *(Literal **)&(pLVar4->super_Term).field_9._vars;
            if (((ulong)pLVar4 & 1) != 0) {
              uVar12 = 3;
              goto LAB_002b70f6;
            }
            iVar1 = iVar1 + 2;
          } while (*(int *)&(pLVar4->super_Term).field_0xc < 0);
        }
        else {
          iVar1 = 0;
        }
        uVar12 = (pLVar4->super_Term).field_9._vars;
LAB_002b70f6:
        if (iVar1 + uVar12 == 0) {
          CodeTree::LitInfo::LitInfo(&local_68,this->query,(uint)uVar10);
          uVar8 = (uint)uVar3;
          pLVar6 = (this->lInfos)._array;
          pLVar6[uVar3].opposite = local_68.opposite;
          pLVar6 = pLVar6 + uVar3;
          pLVar6->liIndex = local_68.liIndex;
          pLVar6->litIndex = local_68.litIndex;
          pLVar6->ft = local_68.ft;
          pLVar6 = (this->lInfos)._array;
          pLVar6[uVar3].liIndex = uVar8;
          uVar12 = uVar8 + 1;
          if ((this->query->_literals[uVar10]->super_Term)._functor == 0) {
            CodeTree::LitInfo::getReversed(&local_68,pLVar6 + uVar3);
            pLVar6 = (this->lInfos)._array;
            pLVar6[uVar12].opposite = local_68.opposite;
            pLVar6 = pLVar6 + uVar12;
            pLVar6->liIndex = local_68.liIndex;
            pLVar6->litIndex = local_68.litIndex;
            pLVar6->ft = local_68.ft;
            (this->lInfos)._array[uVar12].liIndex = uVar12;
            uVar12 = uVar8 + 2;
          }
          uVar3 = (ulong)uVar12;
          uVar11 = local_38;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar11);
      if (local_4c != 0) {
        local_48 = (ulong)((uint)local_48 & 0xfffff);
        uVar11 = 0;
        do {
          pLVar4 = this->query->_literals[uVar11];
          if (*(int *)&(pLVar4->super_Term).field_0xc < 0) {
            iVar1 = 0;
            do {
              pLVar4 = *(Literal **)&(pLVar4->super_Term).field_9._vars;
              if (((ulong)pLVar4 & 1) != 0) {
                uVar12 = 3;
                goto LAB_002b71de;
              }
              iVar1 = iVar1 + 2;
            } while (*(int *)&(pLVar4->super_Term).field_0xc < 0);
          }
          else {
            iVar1 = 0;
          }
          uVar12 = (pLVar4->super_Term).field_9._vars;
LAB_002b71de:
          if (iVar1 + uVar12 != 0) {
            CodeTree::LitInfo::LitInfo(&local_68,this->query,(uint)uVar11);
            uVar8 = (uint)uVar3;
            pLVar6 = (this->lInfos)._array;
            pLVar6[uVar3].opposite = local_68.opposite;
            pLVar6 = pLVar6 + uVar3;
            pLVar6->liIndex = local_68.liIndex;
            pLVar6->litIndex = local_68.litIndex;
            pLVar6->ft = local_68.ft;
            pLVar6 = (this->lInfos)._array;
            pLVar6[uVar3].liIndex = uVar8;
            uVar12 = uVar8 + 1;
            if ((this->query->_literals[uVar11]->super_Term)._functor == 0) {
              CodeTree::LitInfo::getReversed(&local_68,pLVar6 + uVar3);
              pLVar6 = (this->lInfos)._array;
              pLVar6[uVar12].opposite = local_68.opposite;
              pLVar6 = pLVar6 + uVar12;
              pLVar6->liIndex = local_68.liIndex;
              pLVar6->litIndex = local_68.litIndex;
              pLVar6->ft = local_68.ft;
              (this->lInfos)._array[uVar12].liIndex = uVar12;
              uVar12 = uVar8 + 2;
            }
            uVar3 = (ulong)uVar12;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != local_48);
      }
    }
    if (this->sres == false) goto LAB_002b72fc;
    if (uVar5 != 0) {
      pLVar6 = (this->lInfos)._array;
      uVar7 = uVar7 + (local_3c == 0);
      lVar9 = 0;
      do {
        CodeTree::LitInfo::getOpposite(&local_68,(LitInfo *)((long)&pLVar6->liIndex + lVar9));
        pLVar6 = (this->lInfos)._array;
        pLVar6[uVar7].opposite = local_68.opposite;
        pLVar6 = pLVar6 + uVar7;
        pLVar6->liIndex = local_68.liIndex;
        pLVar6->litIndex = local_68.litIndex;
        pLVar6->ft = local_68.ft;
        pLVar6 = (this->lInfos)._array;
        pLVar6[uVar7].liIndex = uVar7;
        lVar9 = lVar9 + 0x18;
        uVar7 = uVar7 + 1;
      } while ((ulong)uVar5 * 0x18 != lVar9);
    }
  }
  this->sresLiteral = 0xffffffff;
LAB_002b72fc:
  seekOnlySuccess = local_4c == 0;
  CodeTree::incTimeStamp(&this->tree->super_CodeTree);
  enterLiteral(this,(CodeOp *)((this->tree->super_CodeTree)._entryPoint + 8),seekOnlySuccess);
  return extraout_EAX;
}

Assistant:

void ClauseCodeTree::ClauseMatcher::init(ClauseCodeTree* tree_, Clause* query_, bool sres_)
{
  ASS(!tree_->isEmpty());

  query=query_;
  tree=tree_;
  sres=sres_;
  lms.reset();

#if VDEBUG
  ASS_EQ(tree->_clauseMatcherCounter,0);
  tree->_clauseMatcherCounter++;
#endif

  //init LitInfo records
  unsigned clen=query->length();
  unsigned baseLICnt=clen;
  for(unsigned i=0;i<clen;i++) {
    if((*query)[i]->isEquality()) {
      baseLICnt++;
    }
  }
  unsigned liCnt=sres ? (baseLICnt*2) : baseLICnt;
  lInfos.ensure(liCnt);

  //we put ground literals first
  unsigned liIndex=0;
  for(unsigned i=0;i<clen;i++) {
    if(!(*query)[i]->ground()) {
      continue;
    }
    lInfos[liIndex]=LitInfo(query,i);
    lInfos[liIndex].liIndex=liIndex;
    liIndex++;
    if((*query)[i]->isEquality()) {
      lInfos[liIndex]=LitInfo::getReversed(lInfos[liIndex-1]);
      lInfos[liIndex].liIndex=liIndex;
      liIndex++;
    }
  }
  for(unsigned i=0;i<clen;i++) {
    if((*query)[i]->ground()) {
      continue;
    }
    lInfos[liIndex]=LitInfo(query,i);
    lInfos[liIndex].liIndex=liIndex;
    liIndex++;
    if((*query)[i]->isEquality()) {
      lInfos[liIndex]=LitInfo::getReversed(lInfos[liIndex-1]);
      lInfos[liIndex].liIndex=liIndex;
      liIndex++;
    }
  }
  if(sres) {
    for(unsigned i=0;i<baseLICnt;i++) {
      unsigned newIndex=i+baseLICnt;
      lInfos[newIndex]=LitInfo::getOpposite(lInfos[i]);
      lInfos[newIndex].liIndex=newIndex;
    }
    sresLiteral=sresNoLiteral;
  }

  tree->incTimeStamp();
  enterLiteral(tree->getEntryPoint(), clen==0);
}